

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_ManPrintFanio(Emb_Man_t *p)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  void *__s;
  void *__s_00;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  char Buffer [100];
  double local_b8;
  char local_98 [104];
  
  if (p->nObjData < 1) {
    dVar13 = 0.0;
    local_b8 = 0.0;
    uVar8 = 0;
    uVar10 = 0;
  }
  else {
    piVar2 = p->pObjData;
    uVar9 = 0;
    iVar4 = 0;
    iVar7 = 0;
    uVar10 = 0;
    uVar8 = 0;
    do {
      if (piVar2 == (int *)0x0) {
        uVar8 = 0;
        uVar10 = 0;
        iVar7 = 0;
        iVar4 = 0;
        break;
      }
      uVar11 = piVar2[uVar9];
      if ((uVar9 != 0) && ((uVar11 & 3) == 0)) {
        uVar12 = uVar11 >> 4;
        uVar5 = piVar2[uVar9 + 1];
        iVar7 = iVar7 + uVar12;
        iVar4 = iVar4 + uVar5;
        if (uVar8 <= uVar12) {
          uVar8 = uVar12;
        }
        if ((int)uVar10 <= (int)uVar5) {
          uVar10 = uVar5;
        }
      }
      uVar11 = piVar2[uVar9 + 1] + (uVar11 >> 4) + (int)uVar9 + 5;
      uVar9 = (ulong)uVar11;
    } while ((int)uVar11 < p->nObjData);
    local_b8 = (double)iVar7;
    dVar13 = (double)iVar4;
  }
  uVar11 = uVar8;
  if (1 < uVar8) {
    uVar12 = 0;
    uVar11 = 0;
    uVar5 = uVar8 - 1;
    if (uVar5 != 0) {
      do {
        uVar11 = uVar12 + 1;
        bVar3 = 9 < uVar5;
        uVar5 = uVar5 / 10;
        uVar12 = uVar11;
      } while (bVar3);
    }
  }
  uVar11 = uVar11 * 10 + 10;
  uVar5 = uVar10;
  if (1 < uVar10) {
    uVar6 = 0;
    uVar5 = 0;
    uVar12 = uVar10 - 1;
    if (uVar12 != 0) {
      do {
        uVar5 = uVar6 + 1;
        bVar3 = 9 < uVar12;
        uVar12 = uVar12 / 10;
        uVar6 = uVar5;
      } while (bVar3);
    }
  }
  uVar5 = uVar5 * 10 + 10;
  if ((int)uVar5 < (int)uVar11) {
    uVar5 = uVar11;
  }
  uVar11 = 0x10;
  if (0xe < uVar5 - 1) {
    uVar11 = uVar5;
  }
  if (uVar11 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar11 * 4);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar5 * 4);
  }
  if (uVar11 == 0) {
    __s_00 = (void *)0x0;
  }
  else {
    __s_00 = malloc((long)(int)uVar11 << 2);
  }
  if (__s_00 != (void *)0x0) {
    memset(__s_00,0,(long)(int)uVar5 << 2);
  }
  iVar4 = p->nObjData;
  if ((0 < iVar4) && (piVar2 = p->pObjData, piVar2 != (int *)0x0)) {
    uVar9 = 0;
    do {
      if (((int)uVar9 != 0) && (uVar11 = piVar2[uVar9], (uVar11 & 3) == 0)) {
        uVar12 = piVar2[uVar9 + 1];
        if (uVar11 < 0xa0) {
          uVar11 = uVar11 >> 4;
LAB_007289df:
          if ((int)uVar5 <= (int)uVar11) goto LAB_00728cbe;
          piVar1 = (int *)((long)__s + (ulong)uVar11 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          if (uVar11 < 0x640) {
            uVar11 = uVar11 / 0xa0 + 10;
            goto LAB_007289df;
          }
          if (uVar11 < 16000) {
            uVar11 = uVar11 / 0x640 + 0x14;
            goto LAB_007289df;
          }
          if (uVar11 < 160000) {
            uVar11 = uVar11 / 16000 + 0x1e;
            goto LAB_007289df;
          }
          if (uVar11 < 1600000) {
            uVar11 = uVar11 / 160000 + 0x28;
            goto LAB_007289df;
          }
          if (uVar11 < 16000000) {
            uVar11 = uVar11 / 1600000 + 0x32;
            goto LAB_007289df;
          }
          if (uVar11 < 160000000) {
            uVar11 = uVar11 / 16000000 + 0x3c;
            goto LAB_007289df;
          }
        }
        if ((int)uVar12 < 10) {
          if ((int)uVar12 < 0) goto LAB_00728cbe;
        }
        else if ((int)uVar12 < 100) {
          uVar12 = uVar12 / 10 + 10;
        }
        else if ((int)uVar12 < 1000) {
          uVar12 = uVar12 / 100 + 0x14;
        }
        else if ((int)uVar12 < 10000) {
          uVar12 = uVar12 / 1000 + 0x1e;
        }
        else if ((int)uVar12 < 100000) {
          uVar12 = uVar12 / 10000 + 0x28;
        }
        else if ((int)uVar12 < 1000000) {
          uVar12 = uVar12 / 100000 + 0x32;
        }
        else {
          if (9999999 < (int)uVar12) goto LAB_00728aba;
          uVar12 = uVar12 / 1000000 + 0x3c;
        }
        if ((int)uVar5 <= (int)uVar12) {
LAB_00728cbe:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = (int *)((long)__s_00 + (ulong)uVar12 * 4);
        *piVar1 = *piVar1 + 1;
      }
LAB_00728aba:
      uVar11 = ((uint)piVar2[uVar9] >> 4) + (int)uVar9 + piVar2[uVar9 + 1] + 5;
      uVar9 = (ulong)uVar11;
    } while ((int)uVar11 < iVar4);
  }
  puts("The distribution of fanins and fanouts in the network:");
  puts("         Number   Nodes with fanin  Nodes with fanout");
  if (0 < (int)uVar5) {
    uVar9 = 0;
    do {
      if ((*(int *)((long)__s + uVar9 * 4) != 0) || (*(int *)((long)__s_00 + uVar9 * 4) != 0)) {
        if (uVar9 < 10) {
          printf("%15d : ",uVar9 & 0xffffffff);
        }
        else {
          iVar4 = (int)((uVar9 & 0xffffffff) / 10) * -10;
          dVar14 = (double)(int)((uVar9 & 0xffffffff) / 10);
          dVar15 = pow(10.0,dVar14);
          dVar14 = pow(10.0,dVar14);
          sprintf(local_98,"%d - %d",(ulong)(uint)(((int)uVar9 + iVar4) * (int)dVar15),
                  (ulong)(((int)uVar9 + iVar4 + 1) * (int)dVar14 - 1));
          printf("%15s : ",local_98);
        }
        if (*(int *)((long)__s + uVar9 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        printf("    ");
        if (*(int *)((long)__s_00 + uVar9 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        putchar(10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  dVar15 = (double)(p->nObjs - (p->vCis->nSize + p->vCos->nSize));
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",local_b8 / dVar15,
         dVar13 / dVar15,(ulong)uVar8,(ulong)uVar10);
  return;
}

Assistant:

void Emb_ManPrintFanio( Emb_Man_t * p )
{
    char Buffer[100];
    Emb_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Emb_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Emb_ManNodeNum(p)  );
}